

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

void __thiscall
icu_63::RuleBasedTimeZone::getOffsetInternal
          (RuleBasedTimeZone *this,UDate date,UBool local,int32_t NonExistingTimeOpt,
          int32_t DuplicatedTimeOpt,int32_t *rawOffset,int32_t *dstOffset,UErrorCode *status)

{
  bool bVar1;
  int32_t iVar2;
  Transition *pTVar3;
  TimeZoneRule *this_00;
  void *pvVar4;
  int iVar5;
  int iVar6;
  UDate UVar7;
  
  *rawOffset = 0;
  *dstOffset = 0;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (this->fUpToDate == '\0') {
    *status = U_INVALID_STATE_ERROR;
    return;
  }
  if (this->fHistoricTransitions != (UVector *)0x0) {
    pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,0);
    UVar7 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
    if (UVar7 <= date) {
      iVar5 = this->fHistoricTransitions->count;
      iVar6 = iVar5 + -1;
      pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,iVar6);
      UVar7 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
      if (date <= UVar7) {
        if (0 < iVar5) {
          do {
            iVar6 = iVar5 + -1;
            pTVar3 = (Transition *)UVector::elementAt(this->fHistoricTransitions,iVar6);
            UVar7 = getTransitionTime(this,pTVar3,local,NonExistingTimeOpt,DuplicatedTimeOpt);
            if (UVar7 <= date) goto LAB_001f4994;
            iVar6 = iVar5 + -1;
            bVar1 = 0 < iVar5;
            iVar5 = iVar6;
          } while (iVar6 != 0 && bVar1);
          iVar6 = -1;
        }
LAB_001f4994:
        pvVar4 = UVector::elementAt(this->fHistoricTransitions,iVar6);
        this_00 = *(TimeZoneRule **)((long)pvVar4 + 0x10);
      }
      else {
        if (this->fFinalRules == (UVector *)0x0) {
          this_00 = (TimeZoneRule *)0x0;
        }
        else {
          this_00 = findRuleInFinal(this,date,local,NonExistingTimeOpt,DuplicatedTimeOpt);
        }
        if (this_00 == (TimeZoneRule *)0x0) {
          pvVar4 = UVector::elementAt(this->fHistoricTransitions,iVar6);
          this_00 = *(TimeZoneRule **)((long)pvVar4 + 0x10);
        }
      }
      goto LAB_001f48cd;
    }
  }
  this_00 = &this->fInitialRule->super_TimeZoneRule;
LAB_001f48cd:
  if (this_00 != (TimeZoneRule *)0x0) {
    iVar2 = TimeZoneRule::getRawOffset(this_00);
    *rawOffset = iVar2;
    iVar2 = TimeZoneRule::getDSTSavings(this_00);
    *dstOffset = iVar2;
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::getOffsetInternal(UDate date, UBool local,
                                     int32_t NonExistingTimeOpt, int32_t DuplicatedTimeOpt,
                                     int32_t& rawOffset, int32_t& dstOffset,
                                     UErrorCode& status) const {
    rawOffset = 0;
    dstOffset = 0;

    if (U_FAILURE(status)) {
        return;
    }
    if (!fUpToDate) {
        // Transitions are not yet resolved.  We cannot do it here
        // because this method is const.  Thus, do nothing and return
        // error status.
        status = U_INVALID_STATE_ERROR;
        return;
    }
    const TimeZoneRule *rule = NULL;
    if (fHistoricTransitions == NULL) {
        rule = fInitialRule;
    } else {
        UDate tstart = getTransitionTime((Transition*)fHistoricTransitions->elementAt(0),
            local, NonExistingTimeOpt, DuplicatedTimeOpt);
        if (date < tstart) {
            rule = fInitialRule;
        } else {
            int32_t idx = fHistoricTransitions->size() - 1;
            UDate tend = getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                local, NonExistingTimeOpt, DuplicatedTimeOpt);
            if (date > tend) {
                if (fFinalRules != NULL) {
                    rule = findRuleInFinal(date, local, NonExistingTimeOpt, DuplicatedTimeOpt);
                }
                if (rule == NULL) {
                    // no final rules or the given time is before the first transition
                    // specified by the final rules -> use the last rule 
                    rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
                }
            } else {
                // Find a historical transition
                while (idx >= 0) {
                    if (date >= getTransitionTime((Transition*)fHistoricTransitions->elementAt(idx),
                        local, NonExistingTimeOpt, DuplicatedTimeOpt)) {
                        break;
                    }
                    idx--;
                }
                rule = ((Transition*)fHistoricTransitions->elementAt(idx))->to;
            }
        }
    }
    if (rule != NULL) {
        rawOffset = rule->getRawOffset();
        dstOffset = rule->getDSTSavings();
    }
}